

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::chipErase(Samba *this,uint32_t start_addr)

{
  uint uVar1;
  uint uVar2;
  SambaError *pSVar3;
  pointer pSVar4;
  char local_68 [4];
  int l;
  uint8_t cmd [64];
  uint32_t start_addr_local;
  Samba *this_local;
  
  if ((this->_canChipErase & 1U) == 0) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x)\n","chipErase",(ulong)start_addr);
  }
  uVar1 = snprintf(local_68,0x40,"X%08X#",(ulong)start_addr);
  pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  uVar2 = (*pSVar4->_vptr_SerialPort[6])(pSVar4,local_68,(ulong)uVar1);
  if (uVar2 != uVar1) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar4->_vptr_SerialPort[9])(pSVar4,5000);
  pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar4->_vptr_SerialPort[5])(pSVar4,local_68,3);
  pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar4->_vptr_SerialPort[9])(pSVar4,1000);
  if (local_68[0] != 'X') {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  return;
}

Assistant:

void
Samba::chipErase(uint32_t start_addr)
{
    if (!_canChipErase)
        throw SambaError();

    uint8_t cmd[64];

    if (_debug)
        printf("%s(addr=%#x)\n", __FUNCTION__, start_addr);

    int l = snprintf((char*) cmd, sizeof(cmd), "X%08X#", start_addr);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_LONG);
    _port->read(cmd, 3); // Expects "X\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'X')
        throw SambaError();
}